

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

int linfwrt(lindef *lin,osfildef *fp)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  FILE *in_RSI;
  long in_RDI;
  mcmon *objn;
  uchar *objp;
  uint pgcnt;
  size_t len;
  uchar buf [261];
  mcmcxdef *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined1 local_128;
  byte local_127;
  undefined1 auStack_126 [4];
  undefined1 auStack_122 [266];
  FILE *local_18;
  long local_10;
  int local_4;
  
  local_128 = (undefined1)*(undefined4 *)(in_RDI + 0xb8);
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar2 = strlen((char *)(in_RDI + 0x268));
  if (sVar2 < 0x100) {
    local_127 = (byte)sVar2;
    oswp4(auStack_126,*(unsigned_long *)(local_10 + 0x260));
    memcpy(auStack_122,(void *)(local_10 + 0x268),(ulong)local_127);
    sVar2 = fwrite(&local_128,(long)(int)(local_127 + 6),1,local_18);
    if (sVar2 == 1) {
      if (*(long *)(local_10 + 0x260) == 0) {
        local_4 = 0;
      }
      else {
        lVar3 = local_10 + 0x160;
        for (iVar1 = (int)(*(long *)(local_10 + 0x260) - 1U >> 10) + 1; iVar1 != 0;
            iVar1 = iVar1 + -1) {
          in_stack_fffffffffffffec0 =
               (mcmcxdef *)
               mcmlck((mcmcxdef *)CONCAT44(iVar1,in_stack_fffffffffffffec8),
                      (mcmon)((ulong)in_stack_fffffffffffffec0 >> 0x30));
          sVar2 = fwrite(in_stack_fffffffffffffec0,0x1000,1,local_18);
          if (sVar2 != 1) {
            return 1;
          }
          mcmunlck(in_stack_fffffffffffffec0,(mcmon)((ulong)lVar3 >> 0x30));
          lVar3 = lVar3 + 2;
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int linfwrt(lindef *lin, osfildef *fp)
{
#   define  linf ((linfdef *)lin)
    uchar   buf[UCHAR_MAX + 6];
    size_t  len;
    uint    pgcnt;
    uchar  *objp;
    mcmon  *objn;

    buf[0] = lin->linid;
    len = strlen(linf->linfnam);
    if (len > UCHAR_MAX)
        return FALSE;
    buf[1] = (uchar)len;
    oswp4(buf + 2, linf->linfcrec);
    memcpy(buf + 6, linf->linfnam, (size_t)buf[1]);
    if (osfwb(fp, buf, (int)(buf[1] + 6))) return(TRUE);
    
    /* write the debug source pages */
    if (!linf->linfcrec) return(FALSE);          /* no debug records at all */
    pgcnt = 1 + ((linf->linfcrec - 1) >> 10);     /* figure number of pages */
    
    for (objn = linf->linfpg ; pgcnt ; ++objn, --pgcnt)
    {
        objp = mcmlck(linf->linfmem, *objn);
        if (osfwb(fp, objp, (1024 * DBGLINFSIZ))) return(TRUE);
        mcmunlck(linf->linfmem, *objn);
    }
    
    return(FALSE);

#   undef  linf
}